

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
DeleteProperty_Internal<true>
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  ScriptContext *scriptContext;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
  *pEVar1;
  PropertyRecord *pPVar2;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  code *pcVar4;
  uint uVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  uint32 index;
  BOOL BVar9;
  undefined4 *puVar10;
  RecyclableObject *pRVar11;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *this_01;
  Type *pTVar12;
  byte bVar13;
  ScriptContext *this_02;
  char16_t *form;
  PropertyOperationFlags propertyOperationFlags_00;
  PropertyId propertyId_00;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  PropertyId local_34;
  
  bVar6 = (this->super_DynamicTypeHandler).flags;
  while ((bVar6 & 4) != 0) {
    this = ConvertToNonSharedSimpleDictionaryType(this,instance);
    bVar6 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
            super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
            super_DynamicTypeHandler.flags;
  }
  pTVar12 = (instance->super_RecyclableObject).type.ptr;
  propertyRecord = (PropertyRecord *)CONCAT44(propertyRecord._4_4_,propertyOperationFlags);
  if (*(char *)&pTVar12[1].javascriptLibrary.ptr == '\x01') {
    if (((bVar6 & 0x10) != 0) || (*(char *)((long)&pTVar12[1].javascriptLibrary.ptr + 1) == '\x01'))
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x6ab,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar7) goto LAB_00e14667;
      *puVar10 = 0;
    }
    DynamicObject::ChangeType(instance);
    pTVar12 = (instance->super_RecyclableObject).type.ptr;
  }
  scriptContext =
       (((pTVar12->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  this_02 = scriptContext;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x6b3,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar7) goto LAB_00e14667;
    *puVar10 = 0;
    this_02 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  }
  local_48 = ScriptContext::GetPropertyName(this_02,propertyId);
  this_00 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
            super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).propertyMap.
            ptr;
  uVar8 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,&local_48);
  uVar5 = DAT_015bf338;
  if ((int)uVar8 < 0) {
    bVar7 = DynamicObject::HasObjectArray(instance);
    if ((bVar7) && (local_48->isNumeric == true)) {
      index = PropertyRecord::GetNumericValue(local_48);
      BVar9 = DynamicTypeHandler::DeleteItem
                        (&this->super_DynamicTypeHandler,instance,index,
                         (PropertyOperationFlags)propertyRecord);
      return BVar9;
    }
    return 1;
  }
  pEVar1 = (this_00->entries).ptr;
  bVar6 = *(PropertyAttributes *)
           ((long)&pEVar1[uVar8].
                   super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
                   .
                   super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .
                   super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
                   .
                   super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>_>
                   .
                   super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
                   .value + 1);
  if ((bVar6 & 8) != 0) {
    return 1;
  }
  local_34 = propertyId;
  if ((bVar6 & 0x12) != 2) {
    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
              ((PropertyOperationFlags)propertyRecord,scriptContext,(PCWSTR)(local_48 + 1));
    return 0;
  }
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)(pEVar1 + uVar8);
  if (descriptor->propertyIndex == -1) {
LAB_00e14541:
    descriptor->Attributes = '\x0e';
    if ((char)((instance->super_RecyclableObject).type.ptr)->flags < '\0') {
      DynamicObject::ChangeType(instance);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,local_34,(Var)0x0,SideEffects_Any);
    return 1;
  }
  pPVar2 = (PropertyRecord *)
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  bVar6 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
          super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).field_0x28;
  if (((int)DAT_015bf338 < 1 || (bVar6 & 2) != 0) ||
     (bVar13 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
               super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
               numDeletedProperties + 1,
     (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
     super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).numDeletedProperties
          = bVar13, bVar13 < uVar5)) {
    pRVar3 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
             super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
             singletonInstance.ptr;
    propertyRecord = pPVar2;
    if ((pRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       ((DynamicObject *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef != instance)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x6f4,
                                  "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                  ,
                                  "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                 );
      if (!bVar7) {
LAB_00e14667:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar10 = 0;
    }
    SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
    InvalidateFixedField<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,local_48,
               descriptor,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
    if (((((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
         super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
         super_DynamicTypeHandler.flags & 0x20) != 0) {
      ScriptContext::InvalidateProtoCaches(scriptContext,local_34);
    }
    if ((((((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
          super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).field_0x28 & 2)
         == 0) ||
       (bVar7 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
                TryRegisterDeletedPropertyIndex
                          ((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>
                            *)this,instance,descriptor->propertyIndex), !bVar7)) {
      DynamicTypeHandler::SetSlotUnchecked(instance,descriptor->propertyIndex,propertyRecord);
    }
    goto LAB_00e14541;
  }
  if (((bVar6 & 4) == 0) &&
     (pRVar11 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                          (&instance->super_RecyclableObject,(RecyclableObject **)0x0),
     pRVar11 == (RecyclableObject *)0x0)) {
    bVar7 = Phases::IsEnabled((Phases *)&DAT_015bc490,TypeHandlerTransitionPhase);
    propertyId_00 = local_34;
    propertyOperationFlags_00 = (PropertyOperationFlags)propertyRecord;
    if (!bVar7) goto LAB_00e1460b;
    form = L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n";
  }
  else {
    bVar7 = Phases::IsEnabled((Phases *)&DAT_015bc490,TypeHandlerTransitionPhase);
    propertyId_00 = local_34;
    propertyOperationFlags_00 = (PropertyOperationFlags)propertyRecord;
    if (!bVar7) goto LAB_00e1460b;
    form = L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n";
  }
  propertyId_00 = local_34;
  Output::Print(form);
  Output::Flush();
LAB_00e1460b:
  this_01 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
            ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>
                      ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                       instance);
  BVar9 = DeleteProperty_Internal<false>
                    (&this_01->
                      super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>,
                     instance,propertyId_00,propertyOperationFlags_00);
  return BVar9;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty_Internal(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        if(!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(propertyId != Constants::NoProperty);
            PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->Attributes & (PropertyDeleted | (!allowLetConstGlobal ? PropertyLetConstGlobal : 0)))
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable) ||
                    (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal)))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyRecord->GetBuffer());

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
#endif

                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(propertyId);
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if(!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);
                return true;
            }

            // Check for a numeric propertyRecord only if objectArray available
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteItem(instance, propertyRecord->GetNumericValue(), propertyOperationFlags);
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty_Internal<allowLetConstGlobal>(instance, propertyId, propertyOperationFlags);
        }
        return true;
    }